

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

char * archive_read_disk_uname(archive *_a,la_int64_t uid)

{
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_uname");
  if ((iVar2 == 0) &&
     (UNRECOVERED_JUMPTABLE = (code *)_a[1].error_string.buffer_length,
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    uVar1._0_4_ = _a[1].current_codepage;
    uVar1._4_4_ = _a[1].current_oemcp;
    pcVar3 = (char *)(*UNRECOVERED_JUMPTABLE)(uVar1,uid);
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

const char *
archive_read_disk_uname(struct archive *_a, la_int64_t uid)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_disk_uname"))
		return (NULL);
	if (a->lookup_uname == NULL)
		return (NULL);
	return ((*a->lookup_uname)(a->lookup_uname_data, uid));
}